

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.h
# Opt level: O0

void __thiscall
YacclabTests::CheckAlgorithms<void(Labeling::*)()>
          (YacclabTests *this,string *title,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ccl_algorithms,offset_in_Labeling_to_subr func)

{
  GlobalConfig *pGVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  const_reference pvVar8;
  Labeling *pLVar9;
  reference pvVar10;
  reference pvVar11;
  Labeling *pLVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pYVar13;
  undefined4 extraout_var_01;
  const_iterator __first;
  const_iterator __last;
  ulong uVar14;
  long lVar15;
  long *plVar16;
  long in_R8;
  reference rVar17;
  iterator iVar18;
  _Bit_iterator _Var19;
  code *local_798;
  allocator local_6b9;
  string local_6b8 [32];
  string local_698 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678 [32];
  reference local_658;
  allocator local_641;
  string local_640 [32];
  string local_620 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0 [32];
  reference local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *algo_name_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  uint j;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_588;
  uint local_580;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_579;
  uint longest_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  _Bit_iterator_base local_550;
  _Bit_type *local_540;
  uint local_538;
  _Bit_type *local_528;
  uint local_520;
  _Bit_type *local_518;
  uint local_510;
  _Bit_type *local_508;
  uint local_500;
  _Bit_type *local_4f8;
  uint local_4f0;
  _Bit_iterator_base local_4e8;
  path local_4d8;
  path local_4b8;
  path local_498;
  path local_478;
  reference local_458;
  byte local_441;
  long *plStack_440;
  bool correct;
  YacclabTensorOutput *labels_to_check;
  _Bit_type local_430;
  Labeling *local_428;
  Labeling *algorithm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *algo_name;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  uint j_1;
  unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_> labels_correct;
  YacclabTensorOutput *correct_algo_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8 [32];
  path local_3a8;
  path local_388;
  undefined1 local_368 [8];
  path filename_path;
  string filename;
  uint local_324;
  uint file;
  size_t filenames_size;
  string local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [32];
  undefined1 local_2b8 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  filenames;
  undefined1 local_280 [8];
  path is_path;
  undefined1 local_240 [8];
  path dataset_path;
  string dataset_name;
  uint local_1fc;
  uint i;
  Labeling *correct_algo;
  out_of_range anon_var_0;
  string local_190 [32];
  string local_170 [8];
  string correct_algo_name;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_149;
  undefined1 local_148 [6];
  bool stop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_fail;
  allocator<bool> local_11a;
  bool local_119;
  undefined1 local_118 [8];
  vector<bool,_std::allocator<bool>_> stats;
  OutputBox ob;
  offset_in_Labeling_to_subr func_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ccl_algorithms_local;
  string *title_local;
  YacclabTests *this_local;
  
  OutputBox::OutputBox
            ((OutputBox *)
             &stats.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,title,0x50,2);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(ccl_algorithms);
  local_119 = true;
  std::allocator<bool>::allocator(&local_11a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_118,sVar7,&local_119,&local_11a);
  std::allocator<bool>::~allocator(&local_11a);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(ccl_algorithms);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_149);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_148,sVar7,&local_149);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_149);
  bVar2 = 0;
  std::__cxx11::string::string(local_170);
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](ccl_algorithms,0);
  pLVar9 = LabelingMapSingleton::GetLabeling(pvVar8);
  (*pLVar9->_vptr_Labeling[7])(local_190);
  std::__cxx11::string::operator=(local_170,local_190);
  std::__cxx11::string::~string(local_190);
  pLVar9 = LabelingMapSingleton::GetLabeling((string *)local_170);
  local_1fc = 0;
  do {
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->mode_cfg_->check_datasets);
    if (sVar7 <= local_1fc) {
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(ccl_algorithms);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_579);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&longest_name,sVar7 & 0xffffffff,&local_579);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_579);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(ccl_algorithms);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(ccl_algorithms);
      local_588 = std::
                  max_element<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&)>
                            (__first._M_current,__last._M_current,CompareLengthCvString);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_588);
      local_580 = std::__cxx11::string::length();
      __range2._4_4_ = 0;
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(ccl_algorithms);
      algo_name_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(ccl_algorithms);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&algo_name_1);
        if (!bVar3) break;
        local_5c0 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
        std::operator+((char *)local_620,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40e9cd
                      );
        std::operator+(local_600,(char *)local_620);
        uVar14 = (ulong)local_580;
        lVar15 = std::__cxx11::string::size();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_640,uVar14 - lVar15,'-',&local_641);
        std::operator+(local_5e0,local_600);
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&longest_name,(ulong)__range2._4_4_);
        std::__cxx11::string::operator=((string *)pvVar10,(string *)local_5e0);
        std::__cxx11::string::~string((string *)local_5e0);
        std::__cxx11::string::~string(local_640);
        std::allocator<char>::~allocator((allocator<char> *)&local_641);
        std::__cxx11::string::~string((string *)local_600);
        std::__cxx11::string::~string(local_620);
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_118,(ulong)__range2._4_4_);
        local_658 = rVar17;
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_658);
        if (bVar3) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&longest_name,(ulong)__range2._4_4_);
          std::__cxx11::string::operator+=((string *)pvVar10,"-> correct!");
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_148,(ulong)__range2._4_4_);
          std::operator+((char *)local_698,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "-> NOT correct, it first fails on \'");
          std::operator+(local_678,(char *)local_698);
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&longest_name,(ulong)__range2._4_4_);
          std::__cxx11::string::operator+=((string *)pvVar10,(string *)local_678);
          std::__cxx11::string::~string((string *)local_678);
          std::__cxx11::string::~string(local_698);
        }
        __range2._4_4_ = __range2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6b8,"Report",&local_6b9);
      OutputBox::DisplayReport
                ((OutputBox *)
                 &stats.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage,(string *)local_6b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&longest_name);
      std::__cxx11::string::~string(local_6b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&longest_name);
      std::__cxx11::string::~string(local_170);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_118);
      OutputBox::~OutputBox
                ((OutputBox *)
                 &stats.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
      return;
    }
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->mode_cfg_->check_datasets,(ulong)local_1fc);
    std::__cxx11::string::string((string *)&dataset_path.field_0x18,(string *)pvVar10);
    pGVar1 = this->glob_cfg_;
    filesystem::path::path((path *)&is_path.field_0x18,(string *)&dataset_path.field_0x18);
    filesystem::operator/((path *)local_240,&pGVar1->input_path,(path *)&is_path.field_0x18);
    filesystem::path::~path((path *)&is_path.field_0x18);
    filesystem::path::path
              ((path *)&filenames.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               &this->glob_cfg_->input_txt);
    filesystem::operator/
              ((path *)local_280,(path *)local_240,
               (path *)&filenames.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    filesystem::path::~path
              ((path *)&filenames.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)local_2b8);
    bVar3 = LoadFileList(this,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                               *)local_2b8,(path *)local_280);
    if (bVar3) {
      sVar7 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)local_2b8);
      OutputBox::StartUnitaryBox
                ((OutputBox *)
                 &stats.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage,(string *)&dataset_path.field_0x18,sVar7);
      local_324 = 0;
      while( true ) {
        bVar3 = false;
        if (local_324 < sVar7) {
          bVar3 = (bool)(bVar2 ^ 1);
        }
        if (!bVar3) break;
        OutputBox::UpdateUnitaryBox
                  ((OutputBox *)
                   &stats.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,local_324);
        pvVar11 = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                *)local_2b8,(ulong)local_324);
        std::__cxx11::string::string((string *)&filename_path.field_0x18,(string *)pvVar11);
        filesystem::path::path(&local_388,(string *)&filename_path.field_0x18);
        filesystem::operator/((path *)local_368,(path *)local_240,&local_388);
        filesystem::path::~path(&local_388);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](ccl_algorithms,0);
        pLVar12 = LabelingMapSingleton::GetLabeling(pvVar8);
        iVar5 = (*pLVar12->_vptr_Labeling[9])();
        filesystem::path::string_abi_cxx11_(&local_3a8);
        bVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x20))
                          ((long *)CONCAT44(extraout_var,iVar5),&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        if (((bVar4 ^ 0xff) & 1) == 0) {
          (*pLVar9->_vptr_Labeling[2])();
          labels_correct._M_t.
          super___uniq_ptr_impl<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>._M_t
          .super__Tuple_impl<0UL,_YacclabTensorOutput_*,_std::default_delete<YacclabTensorOutput>_>.
          super__Head_base<0UL,_YacclabTensorOutput_*,_false>._M_head_impl._0_4_ =
               (*pLVar9->_vptr_Labeling[10])();
          labels_correct._M_t.
          super___uniq_ptr_impl<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>._M_t
          .super__Tuple_impl<0UL,_YacclabTensorOutput_*,_std::default_delete<YacclabTensorOutput>_>.
          super__Head_base<0UL,_YacclabTensorOutput_*,_false>._M_head_impl._4_4_ = extraout_var_00;
          (**(code **)(*(long *)labels_correct._M_t.
                                super___uniq_ptr_impl<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_YacclabTensorOutput_*,_std::default_delete<YacclabTensorOutput>_>
                                .super__Head_base<0UL,_YacclabTensorOutput_*,_false>._M_head_impl +
                      0x28))();
          (**(code **)(*(long *)labels_correct._M_t.
                                super___uniq_ptr_impl<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_YacclabTensorOutput_*,_std::default_delete<YacclabTensorOutput>_>
                                .super__Head_base<0UL,_YacclabTensorOutput_*,_false>._M_head_impl +
                      0x40))(&stack0xfffffffffffffc08);
          (*pLVar9->_vptr_Labeling[5])();
          pYVar13 = std::unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>
                    ::operator->((unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>
                                  *)&stack0xfffffffffffffc08);
          uVar6 = (*pLVar9->_vptr_Labeling[8])();
          (*(pYVar13->super_YacclabTensor)._vptr_YacclabTensor[3])(pYVar13,(ulong)(uVar6 & 1));
          __range4._4_4_ = 0;
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(ccl_algorithms);
          algo_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(ccl_algorithms);
          while( true ) {
            bVar3 = __gnu_cxx::operator!=
                              (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&algo_name);
            if (!bVar3) break;
            algorithm = (Labeling *)
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end4);
            local_428 = LabelingMapSingleton::GetLabeling((string *)algorithm);
            rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_118,
                                (ulong)__range4._4_4_);
            local_430 = rVar17._M_mask;
            labels_to_check = (YacclabTensorOutput *)rVar17._M_p;
            bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&labels_to_check);
            if (bVar3) {
              plVar16 = (long *)((long)&local_428->_vptr_Labeling + in_R8);
              local_798 = (code *)func;
              if ((func & 1) != 0) {
                local_798 = *(code **)(*plVar16 + (func - 1));
              }
              (*local_798)(plVar16);
              iVar5 = (*local_428->_vptr_Labeling[10])();
              plStack_440 = (long *)CONCAT44(extraout_var_01,iVar5);
              (**(code **)(*plStack_440 + 0x28))();
              plVar16 = plStack_440;
              uVar6 = (*local_428->_vptr_Labeling[8])();
              (**(code **)(*plVar16 + 0x18))(plVar16,uVar6 & 1);
              pYVar13 = std::
                        unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>::
                        operator->((unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>
                                    *)&stack0xfffffffffffffc08);
              iVar5 = (*(pYVar13->super_YacclabTensor)._vptr_YacclabTensor[7])(pYVar13,plStack_440);
              local_441 = (byte)iVar5 & 1;
              (*local_428->_vptr_Labeling[5])();
              if ((local_441 & 1) == 0) {
                rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)local_118,
                                    (ulong)__range4._4_4_);
                local_458 = rVar17;
                std::_Bit_reference::operator=(&local_458,false);
                filesystem::path::path(&local_4b8,(string *)&dataset_path.field_0x18);
                filesystem::path::path(&local_4d8,(string *)&filename_path.field_0x18);
                filesystem::operator/(&local_498,&local_4b8,&local_4d8);
                filesystem::path::string_abi_cxx11_(&local_478);
                pvVar10 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_148,(ulong)__range4._4_4_);
                std::__cxx11::string::operator=((string *)pvVar10,(string *)&local_478);
                std::__cxx11::string::~string((string *)&local_478);
                filesystem::path::~path(&local_498);
                filesystem::path::~path(&local_4d8);
                filesystem::path::~path(&local_4b8);
                iVar18 = std::vector<bool,_std::allocator<bool>_>::begin
                                   ((vector<bool,_std::allocator<bool>_> *)local_118);
                local_508 = iVar18.super__Bit_iterator_base._M_p;
                local_500 = iVar18.super__Bit_iterator_base._M_offset;
                local_4f8 = local_508;
                local_4f0 = local_500;
                iVar18 = std::vector<bool,_std::allocator<bool>_>::end
                                   ((vector<bool,_std::allocator<bool>_> *)local_118);
                local_528 = iVar18.super__Bit_iterator_base._M_p;
                local_520 = iVar18.super__Bit_iterator_base._M_offset;
                local_518 = local_528;
                local_510 = local_520;
                _Var19 = std::adjacent_find<std::_Bit_iterator,std::not_equal_to<int>>
                                   (local_4f8,local_4f0,local_528,local_520);
                local_540 = _Var19.super__Bit_iterator_base._M_p;
                local_538 = _Var19.super__Bit_iterator_base._M_offset;
                local_4e8._M_p = local_540;
                local_4e8._M_offset = local_538;
                iVar18 = std::vector<bool,_std::allocator<bool>_>::end
                                   ((vector<bool,_std::allocator<bool>_> *)local_118);
                messages.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)iVar18.super__Bit_iterator_base._M_p;
                local_550._M_offset = iVar18.super__Bit_iterator_base._M_offset;
                local_550._M_p =
                     (_Bit_type *)
                     messages.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bVar3 = std::operator==(&local_4e8,&local_550);
                if (bVar3) {
                  bVar2 = 1;
                  break;
                }
              }
            }
            __range4._4_4_ = __range4._4_4_ + 1;
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          std::unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>::
          ~unique_ptr((unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_> *)
                      &stack0xfffffffffffffc08);
        }
        else {
          std::operator+((char *)&correct_algo_out,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Unable to open \'");
          std::operator+(local_3c8,(char *)&correct_algo_out);
          OutputBox::Cmessage((OutputBox *)
                              &stats.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,local_3c8);
          std::__cxx11::string::~string((string *)local_3c8);
          std::__cxx11::string::~string((string *)&correct_algo_out);
        }
        filesystem::path::~path((path *)local_368);
        std::__cxx11::string::~string((string *)&filename_path.field_0x18);
        local_324 = local_324 + 1;
      }
      OutputBox::StopUnitaryBox
                ((OutputBox *)
                 &stats.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
    }
    else {
      filesystem::path::string_abi_cxx11_((path *)&filenames_size);
      std::operator+((char *)local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Unable to open \'");
      std::operator+(local_2d8,(char *)local_2f8);
      OutputBox::Cwarning((OutputBox *)
                          &stats.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage,local_2d8,
                          (string *)&dataset_path.field_0x18);
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string(local_2f8);
      std::__cxx11::string::~string((string *)&filenames_size);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)local_2b8);
    filesystem::path::~path((path *)local_280);
    filesystem::path::~path((path *)local_240);
    std::__cxx11::string::~string((string *)&dataset_path.field_0x18);
    local_1fc = local_1fc + 1;
  } while( true );
}

Assistant:

void CheckAlgorithms(const std::string& title, const std::vector<std::string>& ccl_algorithms, const FnP func, Args&&... args) {

		OutputBox ob(title);

		std::vector<bool> stats(ccl_algorithms.size(), true);  // True if the i-th algorithm is correct, false otherwise
		std::vector<std::string> first_fail(ccl_algorithms.size());  // Name of the file on which algorithm fails the first time
		bool stop = false; // True if all the algorithms are not correct

		std::string correct_algo_name;
		try {
			correct_algo_name = LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->CheckAlg();
		}
		catch (std::out_of_range) {
			ob.Cwarning("No correct algorithm is available, correctness test skipped.");
			return;
		}
		Labeling* correct_algo = LabelingMapSingleton::GetLabeling(correct_algo_name);

		for (unsigned i = 0; i < mode_cfg_.check_datasets.size(); ++i) { // For every dataset in the check_datasets list
			std::string dataset_name(mode_cfg_.check_datasets[i]);
			path dataset_path(glob_cfg_.input_path / path(dataset_name));
			path is_path = dataset_path / path(glob_cfg_.input_txt); // files.txt path

			// Load list of images on which ccl_algorithms must be tested
			std::vector<std::pair<std::string, bool>> filenames; // first: filename, second: state of filename (find or not)
			if (!LoadFileList(filenames, is_path)) {
				ob.Cwarning("Unable to open '" + is_path.string() + "'", dataset_name);
				continue;
			}

			// Number of files
			size_t filenames_size = filenames.size();
			ob.StartUnitaryBox(dataset_name, filenames_size);

			for (unsigned file = 0; file < filenames_size && !stop; ++file) { // For each file in list
				ob.UpdateUnitaryBox(file);

				std::string filename = filenames[file].first;
				path filename_path = dataset_path / path(filename);

				// Load image
				if (!LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->GetInput()->ReadBinary(filename_path.string())) {
					ob.Cmessage("Unable to open '" + filename + "'");
					continue;
				}

				// These variables aren't necessary
				// unsigned n_labels_correct, n_labels_to_control;
				
				correct_algo->PerformLabeling();
				//n_labels_correct = sauf->n_labels_;
                YacclabTensorOutput* correct_algo_out = correct_algo->GetOutput();
                correct_algo_out->PrepareForCheck();

                std::unique_ptr<YacclabTensorOutput> labels_correct = correct_algo_out->Copy();

                correct_algo->FreeLabelingData();

                labels_correct->NormalizeLabels(correct_algo->IsLabelBackground());

				unsigned j = 0;
				for (const auto& algo_name : ccl_algorithms) {
					Labeling *algorithm = LabelingMapSingleton::GetLabeling(algo_name);

					// Perform labeling on current algorithm if it has no previously failed
					if (stats[j]) {
						(algorithm->*func)(std::forward<Args>(args)...);
                        YacclabTensorOutput* labels_to_check = algorithm->GetOutput();
                        labels_to_check->PrepareForCheck();
                        labels_to_check->NormalizeLabels(algorithm->IsLabelBackground());
                        const bool correct = labels_correct->Equals(labels_to_check);
                        // const bool diff = algorithm->Check(correct_algo);
						algorithm->FreeLabelingData();
						if (!correct) {
							stats[j] = false;
							first_fail[j] = (path(dataset_name) / path(filename)).string();

							// Stop check test if all the algorithms fail
							if (adjacent_find(stats.begin(), stats.end(), std::not_equal_to<int>()) == stats.end()) {
								stop = true;
								break;
							}
						}
					}
					++j;
				} // For all the Algorithms in the array
                //correct_algo->FreeLabelingData();

			}// END WHILE (LIST OF IMAGES)
			ob.StopUnitaryBox();
		}// END FOR (LIST OF DATASETS)

		// LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->ReleaseInput();

		 // To display report of correctness test
		std::vector<std::string> messages(static_cast<unsigned int>(ccl_algorithms.size()));
		unsigned longest_name = static_cast<unsigned>(max_element(ccl_algorithms.begin(), ccl_algorithms.end(), CompareLengthCvString)->length());

		unsigned j = 0;
		for (const auto& algo_name : ccl_algorithms) {
			messages[j] = "'" + algo_name + "'" + std::string(longest_name - algo_name.size(), '-');
			if (stats[j]) {
				messages[j] += "-> correct!";
			}
			else {
				messages[j] += "-> NOT correct, it first fails on '" + first_fail[j] + "'";
			}
			++j;
		}
		ob.DisplayReport("Report", messages);
	}